

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_> * __thiscall
Lib::OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_>::operator=
          (OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_> *this,
          OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_> *other)

{
  byte *in_RSI;
  OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_> *in_RDI;
  VirtualIterator<Kernel::Clause_*> *in_stack_ffffffffffffffb8;
  VirtualIterator<Kernel::Clause_*> *in_stack_ffffffffffffffc0;
  MaybeUninit<Lib::VirtualIterator<Kernel::Clause_*>_> *this_00;
  EVP_PKEY_CTX local_18 [8];
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_> *)0x78f277);
    VirtualIterator<Kernel::Clause_*>::~VirtualIterator(in_stack_ffffffffffffffc0);
  }
  if ((*local_10 & 1) != 0) {
    this_00 = &in_RDI->_elem;
    unwrap((OptionBase<Lib::VirtualIterator<Kernel::Clause_*>_> *)0x78f2a1);
    move_if_value<Lib::VirtualIterator<Kernel::Clause_*>,_true>(in_stack_ffffffffffffffb8);
    MaybeUninit<Lib::VirtualIterator<Kernel::Clause_*>_>::init(this_00,local_18);
    VirtualIterator<Kernel::Clause_*>::~VirtualIterator
              ((VirtualIterator<Kernel::Clause_*> *)this_00);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }